

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_17::CrlCheckingPathBuilderDelegate::CheckPathAfterVerification
          (CrlCheckingPathBuilderDelegate *this,CertPathBuilder *path_builder,
          CertPathBuilderResultPath *path)

{
  pointer pbVar1;
  optional<long> max_age_seconds;
  bool bVar2;
  CRLRevocationStatus CVar3;
  CertErrors *pCVar4;
  ParsedExtension *parsed_extension;
  ParsedDistributionPoint *pPVar5;
  ParsedDistributionPoint *pPVar6;
  pointer pbVar7;
  char *in_R9;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t cert_index;
  Input extension_oid;
  Input extension_value;
  string_view raw_crl;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
  distribution_points;
  ParsedExtension crl_dp_extension;
  ParsedDistributionPoint fake_cert_dp;
  AssertHelper local_130;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  internal local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  CertPathErrors *local_110;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> local_108;
  CertificateTrust *local_f0;
  char *local_e8;
  ulong local_e0;
  _Storage<long,_true> local_d8;
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  string local_c8;
  ParsedExtension local_a8;
  ParsedDistributionPoint local_80;
  
  SimplePathBuilderDelegate::CheckPathAfterVerification
            (&this->super_SimplePathBuilderDelegate,path_builder,path);
  bVar2 = CertPathBuilderResultPath::IsValid(path);
  if ((bVar2) &&
     (lVar9 = (long)(path->certs).
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(path->certs).
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar9 != 0)) {
    uVar10 = lVar9 >> 4;
    local_f0 = &path->last_cert_trust;
    local_110 = &path->errors;
    local_e8 = "Unable to check revocation";
    uVar8 = 0;
    do {
      if ((uVar8 != 0) || (bVar2 = CertificateTrust::IsTrustAnchor(local_f0), !bVar2)) {
        cert_index = uVar10 + ~uVar8;
        ParsedDistributionPoint::ParsedDistributionPoint(&local_80);
        local_108.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_start = (ParsedDistributionPoint *)0x0;
        local_108.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ParsedDistributionPoint *)0x0;
        local_108.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value.data_.data_ = (uchar *)0x0;
        local_a8.value.data_.size_ = 0;
        local_a8.oid.data_.data_ = (uchar *)0x0;
        local_a8.oid.data_.size_ = 0;
        local_a8.critical = false;
        parsed_extension = &local_a8;
        extension_oid.data_.size_ = 3;
        extension_oid.data_.data_ = "U\x1d\x1fEncodeValuesTest";
        bVar2 = ParsedCertificate::GetExtension
                          ((path->certs).
                           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[cert_index].
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,extension_oid,parsed_extension);
        pPVar6 = &local_80;
        if (bVar2) {
          extension_value.data_.size_ = (size_t)&local_108;
          extension_value.data_.data_ = (uchar *)local_a8.value.data_.size_;
          local_120[0] = (internal)
                         ParseCrlDistributionPoints
                                   ((bssl *)local_a8.value.data_.data_,extension_value,
                                    (vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                                     *)parsed_extension);
          local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pPVar6 = local_108.
                   super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (!(bool)local_120[0]) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c8,local_120,
                       (AssertionResult *)
                       "ParseCrlDistributionPoints(crl_dp_extension.value, &distribution_points)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_130,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                       ,0x58,local_c8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if (local_128._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_128._M_head_impl + 8))();
            }
            if (local_118 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_118,local_118);
            }
LAB_002a5cf0:
            ::std::
            vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>::
            ~vector(&local_108);
            ParsedDistributionPoint::~ParsedDistributionPoint(&local_80);
            return;
          }
          while ((pPVar5 = &local_80,
                 pPVar6 != local_108.
                           super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                           ._M_impl.super__Vector_impl_data._M_finish &&
                 (pPVar5 = pPVar6,
                 (pPVar6->reasons).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                 super__Optional_payload_base<bssl::der::Input>._M_engaged == true))) {
            pPVar6 = pPVar6 + 1;
          }
          pPVar6 = local_108.
                   super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_108.
              super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_108.
              super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pPVar6 = pPVar5;
          }
          if (pPVar5 != &local_80) {
            pPVar6 = pPVar5;
          }
        }
        pbVar1 = (this->der_crls_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_e0 = uVar8;
        for (pbVar7 = (this->der_crls_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1;
            pbVar7 = pbVar7 + 1) {
          in_R9 = (char *)this->verify_time_;
          local_d8 = (_Storage<long,_true>)this->max_age_;
          uStack_d0 = 1;
          max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._9_7_ = uStack_cf;
          max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = true;
          max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload =
               (_Storage<long,_true>)(_Storage<long,_true>)local_d8._M_value;
          raw_crl._M_str = (pbVar7->_M_dataplus)._M_p;
          raw_crl._M_len = pbVar7->_M_string_length;
          CVar3 = CheckCRL(raw_crl,&path->certs,cert_index,pPVar6,(int64_t)in_R9,max_age_seconds);
          if (CVar3 == GOOD) goto LAB_002a5c99;
          if (CVar3 == REVOKED) {
            pCVar4 = CertPathErrors::GetErrorsForCert(local_110,cert_index);
            CertErrors::AddError(pCVar4,"Certificate is revoked");
            goto LAB_002a5cf0;
          }
        }
        pCVar4 = CertPathErrors::GetErrorsForCert(local_110,cert_index);
        CertErrors::AddError(pCVar4,local_e8);
LAB_002a5c99:
        ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ::~vector(&local_108);
        ParsedDistributionPoint::~ParsedDistributionPoint(&local_80);
        uVar8 = local_e0;
      }
      uVar8 = uVar8 + 1;
      uVar10 = (long)(path->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(path->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
    } while (uVar8 < uVar10);
  }
  return;
}

Assistant:

void CheckPathAfterVerification(const CertPathBuilder &path_builder,
                                  CertPathBuilderResultPath *path) override {
    SimplePathBuilderDelegate::CheckPathAfterVerification(path_builder, path);

    if (!path->IsValid()) {
      return;
    }

    // It would be preferable if this test could use
    // CheckValidatedChainRevocation somehow, but that only supports getting
    // CRLs by http distributionPoints. So this just settles for writing a
    // little bit of wrapper code to test CheckCRL directly.
    const ParsedCertificateList &certs = path->certs;
    for (size_t reverse_i = 0; reverse_i < certs.size(); ++reverse_i) {
      size_t i = certs.size() - reverse_i - 1;

      // Trust anchors bypass OCSP/CRL revocation checks. (The only way to
      // revoke trust anchors is via CRLSet or the built-in SPKI block list).
      if (reverse_i == 0 && path->last_cert_trust.IsTrustAnchor()) {
        continue;
      }

      // RFC 5280 6.3.3.  [If the CRL was not specified in a distribution
      //                  point], assume a DP with both the reasons and the
      //                  cRLIssuer fields omitted and a distribution point
      //                  name of the certificate issuer.
      // Since this implementation only supports URI names in distribution
      // points, this means a default-initialized ParsedDistributionPoint is
      // sufficient.
      ParsedDistributionPoint fake_cert_dp;
      const ParsedDistributionPoint *cert_dp = &fake_cert_dp;

      // If the target cert does have a distribution point, use it.
      std::vector<ParsedDistributionPoint> distribution_points;
      ParsedExtension crl_dp_extension;
      if (certs[i]->GetExtension(der::Input(kCrlDistributionPointsOid),
                                 &crl_dp_extension)) {
        ASSERT_TRUE(ParseCrlDistributionPoints(crl_dp_extension.value,
                                               &distribution_points));
        // TODO(mattm): some test cases (some of the 4.14.* onlySomeReasons
        // tests)) have two CRLs and two distribution points, one point
        // corresponding to each CRL.  Should select the matching point for
        // each CRL.  (Doesn't matter currently since we don't support
        // reasons.)

        // Look for a DistributionPoint without reasons.
        for (const auto &dp : distribution_points) {
          if (!dp.reasons) {
            cert_dp = &dp;
            break;
          }
        }
        // If there were only DistributionPoints with reasons, just use the
        // first one.
        if (cert_dp == &fake_cert_dp && !distribution_points.empty()) {
          cert_dp = &distribution_points[0];
        }
      }

      bool cert_good = false;

      for (const auto &der_crl : der_crls_) {
        CRLRevocationStatus crl_status =
            CheckCRL(der_crl, certs, i, *cert_dp, verify_time_, max_age_);
        if (crl_status == CRLRevocationStatus::REVOKED) {
          path->errors.GetErrorsForCert(i)->AddError(
              cert_errors::kCertificateRevoked);
          return;
        }
        if (crl_status == CRLRevocationStatus::GOOD) {
          cert_good = true;
          break;
        }
      }
      if (!cert_good) {
        // PKITS tests assume hard-fail revocation checking.
        // From PKITS 4.4: "When running the tests in this section, the
        // application should be configured in such a way that the
        // certification path is not accepted unless valid, up-to-date
        // revocation data is available for every certificate in the path."
        path->errors.GetErrorsForCert(i)->AddError(
            cert_errors::kUnableToCheckRevocation);
      }
    }
  }